

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  BumpAllocator *this;
  SequenceRepetitionSyntax *args_1;
  SimpleSequenceExprSyntax *pSVar1;
  BumpAllocator *in_stack_ffffffffffffffc8;
  SequenceRepetitionSyntax *in_stack_ffffffffffffffd0;
  
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa5eb26);
  this = (BumpAllocator *)
         deepClone<slang::syntax::ExpressionSyntax>
                   ((ExpressionSyntax *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (*(long *)(__fn + 0x20) == 0) {
    args_1 = (SequenceRepetitionSyntax *)0x0;
  }
  else {
    args_1 = deepClone<slang::syntax::SequenceRepetitionSyntax>
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::SimpleSequenceExprSyntax,slang::syntax::ExpressionSyntax&,slang::syntax::SequenceRepetitionSyntax*>
                     (this,(ExpressionSyntax *)__child_stack,(SequenceRepetitionSyntax **)args_1);
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const SimpleSequenceExprSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<SimpleSequenceExprSyntax>(
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.repetition ? deepClone(*node.repetition, alloc) : nullptr
    );
}